

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

xml_node<char> * __thiscall
ki::dml::Field<unsigned_int>::as_xml(Field<unsigned_int> *this,xml_document<char> *doc)

{
  char *pcVar1;
  char *value;
  xml_node<char> *this_00;
  xml_attribute<char> *pxVar2;
  memory_pool<char> *this_01;
  string local_40;
  
  this_01 = (memory_pool<char> *)(doc + 0x60);
  pcVar1 = rapidxml::memory_pool<char>::allocate_string
                     (this_01,(this->super_FieldBase).m_name._M_dataplus._M_p,0);
  get_value_string_abi_cxx11_(&local_40,this);
  value = rapidxml::memory_pool<char>::allocate_string(this_01,local_40._M_dataplus._M_p,0);
  std::__cxx11::string::~string((string *)&local_40);
  this_00 = rapidxml::memory_pool<char>::allocate_node(this_01,node_element,pcVar1,value,0,0);
  pcVar1 = get_type_name(this);
  pcVar1 = rapidxml::memory_pool<char>::allocate_string(this_01,pcVar1,0);
  pxVar2 = rapidxml::memory_pool<char>::allocate_attribute(this_01,"TYPE",pcVar1,0,0);
  rapidxml::xml_node<char>::append_attribute(this_00,pxVar2);
  if ((this->super_FieldBase).m_transferable == false) {
    pxVar2 = rapidxml::memory_pool<char>::allocate_attribute(this_01,"NOXFER","TRUE",0,0);
    rapidxml::xml_node<char>::append_attribute(this_00,pxVar2);
  }
  return this_00;
}

Assistant:

rapidxml::xml_node<> *as_xml(rapidxml::xml_document<> &doc) const final
		{
			// Create the node:
			// Copy our current name and value into buffers that are
			// lifetime-dependant on the xml_document, rather than this Field.
			char *name_buffer = doc.allocate_string(m_name.c_str(), 0);
			char *value_buffer = doc.allocate_string(get_value_string().c_str(), 0);
			auto *node = doc.allocate_node(
				rapidxml::node_type::node_element, name_buffer, value_buffer);

			// Create the TYPE attribute
			char *type_attr_value_buffer = doc.allocate_string(get_type_name(), 0);
			auto *type_attr = doc.allocate_attribute("TYPE", type_attr_value_buffer);
			node->append_attribute(type_attr);

			// If we're not transferable, set NOXFER to TRUE
			// NOXFER defaults to FALSE, so we don't need to write it otherwise.
			if (!m_transferable)
			{
				auto *noxfer_attr = doc.allocate_attribute("NOXFER", "TRUE");
				node->append_attribute(noxfer_attr);
			}

			return node;
		}